

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int NV12ToRGB565Matrix(uint8_t *src_y,int src_stride_y,uint8_t *src_uv,int src_stride_uv,
                      uint8_t *dst_rgb565,int dst_stride_rgb565,YuvConstants *yuvconstants,int width
                      ,int height)

{
  int iVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  uint local_40;
  
  if (height == 0 ||
      (width < 1 ||
      (dst_rgb565 == (uint8_t *)0x0 || (src_uv == (uint8_t *)0x0 || src_y == (uint8_t *)0x0)))) {
    iVar1 = -1;
  }
  else {
    if (height < 0) {
      local_40 = -height;
      dst_rgb565 = dst_rgb565 + ~height * dst_stride_rgb565;
      dst_stride_rgb565 = -dst_stride_rgb565;
    }
    else {
      local_40 = height;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    if ((width & 7U) == 0) {
      pcVar4 = NV12ToRGB565Row_SSSE3;
    }
    else {
      pcVar4 = NV12ToRGB565Row_Any_SSSE3;
    }
    if (iVar1 == 0) {
      pcVar4 = NV12ToRGB565Row_C;
    }
    iVar1 = libyuv::TestCpuFlag(0x400);
    if ((width & 0xfU) == 0) {
      pcVar3 = NV12ToRGB565Row_AVX2;
    }
    else {
      pcVar3 = NV12ToRGB565Row_Any_AVX2;
    }
    if (iVar1 == 0) {
      pcVar3 = pcVar4;
    }
    for (uVar2 = 0; local_40 != uVar2; uVar2 = uVar2 + 1) {
      (*pcVar3)(src_y,src_uv,dst_rgb565,yuvconstants,width);
      dst_rgb565 = dst_rgb565 + dst_stride_rgb565;
      src_y = src_y + src_stride_y;
      src_uv = src_uv + (int)(-(uVar2 & 1) & src_stride_uv);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int NV12ToRGB565Matrix(const uint8_t* src_y,
                       int src_stride_y,
                       const uint8_t* src_uv,
                       int src_stride_uv,
                       uint8_t* dst_rgb565,
                       int dst_stride_rgb565,
                       const struct YuvConstants* yuvconstants,
                       int width,
                       int height) {
  int y;
  void (*NV12ToRGB565Row)(
      const uint8_t* y_buf, const uint8_t* uv_buf, uint8_t* rgb_buf,
      const struct YuvConstants* yuvconstants, int width) = NV12ToRGB565Row_C;
  if (!src_y || !src_uv || !dst_rgb565 || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb565 = dst_rgb565 + (height - 1) * dst_stride_rgb565;
    dst_stride_rgb565 = -dst_stride_rgb565;
  }
#if defined(HAS_NV12TORGB565ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB565Row = NV12ToRGB565Row_SSSE3;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      NV12ToRGB565Row = NV12ToRGB565Row_AVX2;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB565Row = NV12ToRGB565Row_NEON;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      NV12ToRGB565Row = NV12ToRGB565Row_MMI;
    }
  }
#endif
#if defined(HAS_NV12TORGB565ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    NV12ToRGB565Row = NV12ToRGB565Row_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      NV12ToRGB565Row = NV12ToRGB565Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    NV12ToRGB565Row(src_y, src_uv, dst_rgb565, yuvconstants, width);
    dst_rgb565 += dst_stride_rgb565;
    src_y += src_stride_y;
    if (y & 1) {
      src_uv += src_stride_uv;
    }
  }
  return 0;
}